

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O1

Result * __thiscall
CoreML::OneHotEncoder::setFeatureEncoding
          (Result *__return_storage_ptr__,OneHotEncoder *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *container)

{
  int iVar1;
  Model *this_00;
  ulong uVar2;
  pointer pbVar3;
  pointer pcVar4;
  Rep *pRVar5;
  OneHotEncoder *pOVar6;
  StringVector *pSVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *obj;
  string *psVar8;
  Arena *pAVar9;
  pointer pbVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> element;
  long *local_50 [2];
  long local_40 [2];
  
  this_00 = (this->super_Model).m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_oneof_case_[0] != 600) {
    Specification::Model::clear_Type(this_00);
    this_00->_oneof_case_[0] = 600;
    uVar2 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar9 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    pOVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::OneHotEncoder>
                       (pAVar9);
    (this_00->Type_).onehotencoder_ = pOVar6;
  }
  pOVar6 = (this_00->Type_).onehotencoder_;
  Specification::OneHotEncoder::clear_stringcategories(pOVar6);
  pbVar10 = (container->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (container->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 != pbVar3) {
    do {
      pcVar4 = (pbVar10->_M_dataplus)._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar4,pcVar4 + pbVar10->_M_string_length);
      if (pOVar6->_oneof_case_[0] != 1) {
        Specification::OneHotEncoder::clear_CategoryType(pOVar6);
        pOVar6->_oneof_case_[0] = 1;
        uVar2 = (pOVar6->super_MessageLite)._internal_metadata_.ptr_;
        pAVar9 = (Arena *)(uVar2 & 0xfffffffffffffffc);
        if ((uVar2 & 1) != 0) {
          pAVar9 = *(Arena **)pAVar9;
        }
        pSVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                           (pAVar9);
        (pOVar6->CategoryType_).stringcategories_ = pSVar7;
      }
      pSVar7 = (pOVar6->CategoryType_).stringcategories_;
      pRVar5 = (pSVar7->vector_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar5 == (Rep *)0x0) {
LAB_002fd8ac:
        obj = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pSVar7->vector_).super_RepeatedPtrFieldBase.arena_);
        psVar8 = (string *)
                 google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                           (&(pSVar7->vector_).super_RepeatedPtrFieldBase,obj);
      }
      else {
        iVar1 = (pSVar7->vector_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar5->allocated_size <= iVar1) goto LAB_002fd8ac;
        (pSVar7->vector_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        psVar8 = (string *)pRVar5->elements[iVar1];
      }
      std::__cxx11::string::_M_assign(psVar8);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar3);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::setFeatureEncoding(const std::vector<std::string>& container) {
        auto ohe = m_spec->mutable_onehotencoder();
        ohe->clear_stringcategories();
        
        for (auto element : container) {
            std::string *value = ohe->mutable_stringcategories()->add_vector();
            *value = element;
        }
        return Result();
    }